

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall
QWhatsThat::QWhatsThat(QWhatsThat *this,QString *txt,QWidget *parent,QWidget *showTextFor)

{
  bool bVar1;
  QFlagsStorage<Qt::AlignmentFlag> QVar2;
  ulong uVar3;
  QTextDocument *pQVar4;
  QWidget *in_RDX;
  QString *in_RSI;
  QWhatsThat *in_RDI;
  long in_FS_OFFSET;
  int sw;
  QRect r;
  QWidget *in_stack_fffffffffffffef8;
  enum_type in_stack_ffffffffffffff00;
  enum_type in_stack_ffffffffffffff04;
  QWidget *in_stack_ffffffffffffff08;
  QWidget *in_stack_ffffffffffffff10;
  int flags;
  QWidget *pQVar5;
  int in_stack_ffffffffffffff18;
  QFlagsStorage<Qt::WindowType> in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  QWidget *in_stack_ffffffffffffff28;
  int local_b4;
  int tabstops;
  QWhatsThat *this_00;
  undefined4 in_stack_ffffffffffffff70;
  QFontMetrics local_88 [8];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined8 local_60;
  QSize local_50;
  QAnyStringView *local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  QCursor local_28 [2];
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDX;
  this_00 = in_RDI;
  QFlags<Qt::WindowType>::QFlags
            ((QFlags<Qt::WindowType> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
             ,(WindowType)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  QWidget::QWidget(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                   (WindowFlags)in_stack_ffffffffffffff1c.i);
  *(undefined ***)&in_RDI->super_QWidget = &PTR_metaObject_00d0d930;
  *(undefined ***)&(in_RDI->super_QWidget).super_QPaintDevice = &PTR__QWhatsThat_00d0dae0;
  QPointer<QWidget>::QPointer<void>
            ((QPointer<QWidget> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  in_RDI->pressed = false;
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (QString *)in_stack_fffffffffffffef8);
  QString::QString((QString *)0x4c2a93);
  if (instance != (QWhatsThat *)0x0) {
    (**(code **)(*(long *)&instance->super_QWidget + 0x20))();
  }
  instance = in_RDI;
  QWidget::setAttribute
            (&this_00->super_QWidget,(WidgetAttribute)((ulong)in_RSI >> 0x20),
             SUB81((ulong)in_RSI >> 0x18,0));
  QWidget::setAttribute
            (&this_00->super_QWidget,(WidgetAttribute)((ulong)in_RSI >> 0x20),
             SUB81((ulong)in_RSI >> 0x18,0));
  tabstops = (int)this_00;
  if (in_RDX != (QWidget *)0x0) {
    QWidget::palette((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    QWidget::setPalette((QWidget *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18),
                        (QPalette *)in_stack_ffffffffffffff10);
  }
  QWidget::setMouseTracking
            ((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
  QWidget::setFocusPolicy
            ((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (FocusPolicy)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  QCursor::QCursor(local_28,ArrowCursor);
  QWidget::setCursor((QWidget *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18),
                     (QCursor *)in_stack_ffffffffffffff10);
  QCursor::~QCursor(local_28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  in_RDI->doc = (QTextDocument *)0x0;
  QWidget::ensurePolished(in_stack_ffffffffffffff28);
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_ffffffffffffff10,(QString *)in_stack_ffffffffffffff08);
  uVar3 = Qt::mightBeRichText(local_48);
  if ((uVar3 & 1) == 0) {
    QGuiApplication::primaryScreen();
    flags = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    local_70 = QScreen::virtualGeometry();
    local_b4 = QRect::width((QRect *)in_stack_fffffffffffffef8);
    local_b4 = local_b4 / 3;
    if (local_b4 < 200) {
      local_b4 = 200;
    }
    else if (300 < local_b4) {
      local_b4 = 300;
    }
    QWidget::fontMetrics(in_stack_fffffffffffffef8);
    QVar2.i = (Int)Qt::operator|(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
    ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff74);
    in_stack_fffffffffffffef8 = (QWidget *)&in_RDI->text;
    in_stack_ffffffffffffff08 = (QWidget *)0x0;
    local_80 = (undefined1  [16])
               QFontMetrics::boundingRect
                         ((QFontMetrics *)in_stack_ffffffffffffff28,
                          (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                          (int)in_stack_ffffffffffffff20,local_b4,in_stack_ffffffffffffff18,flags,
                          in_RSI,tabstops,(int *)CONCAT44(QVar2.i,in_stack_ffffffffffffff70));
    local_38 = (undefined1 *)local_80._0_8_;
    local_30 = (undefined1 *)local_80._8_8_;
    QFontMetrics::~QFontMetrics(local_88);
  }
  else {
    pQVar4 = (QTextDocument *)operator_new(0x10);
    QTextDocument::QTextDocument(pQVar4,(QObject *)0x0);
    in_RDI->doc = pQVar4;
    QTextDocument::setUndoRedoEnabled(SUB81(in_RDI->doc,0));
    pQVar4 = in_RDI->doc;
    QApplication::font(pQVar5);
    QTextDocument::setDefaultFont((QFont *)pQVar4);
    QFont::~QFont(local_18);
    QTextDocument::setHtml((QString *)in_RDI->doc);
    QTextDocument::setUndoRedoEnabled(SUB81(in_RDI->doc,0));
    QTextDocument::adjustSize();
    QRect::setTop((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    QRect::setLeft((QRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    local_60 = QTextDocument::size();
    local_50 = QSizeF::toSize((QSizeF *)in_stack_ffffffffffffff10);
    QRect::setSize((QRect *)CONCAT44(in_stack_ffffffffffffff1c.i,in_stack_ffffffffffffff18),
                   (QSize *)in_stack_ffffffffffffff10);
  }
  bVar1 = dropShadow();
  shadowWidth = 6;
  if (bVar1) {
    shadowWidth = 0;
  }
  pQVar5 = (QWidget *)&local_38;
  QRect::width((QRect *)in_stack_fffffffffffffef8);
  QRect::height((QRect *)in_stack_fffffffffffffef8);
  QWidget::resize(pQVar5,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                  (int)in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWhatsThat::QWhatsThat(const QString& txt, QWidget* parent, QWidget *showTextFor)
    : QWidget(parent, Qt::Popup),
      widget(showTextFor), pressed(false), text(txt)
{
    delete instance;
    instance = this;
    setAttribute(Qt::WA_DeleteOnClose, true);
    setAttribute(Qt::WA_NoSystemBackground, true);
    if (parent)
        setPalette(parent->palette());
    setMouseTracking(true);
    setFocusPolicy(Qt::StrongFocus);
#ifndef QT_NO_CURSOR
    setCursor(Qt::ArrowCursor);
#endif
    QRect r;
    doc = nullptr;
    ensurePolished(); // Ensures style sheet font before size calc
    if (Qt::mightBeRichText(text)) {
        doc = new QTextDocument();
        doc->setUndoRedoEnabled(false);
        doc->setDefaultFont(QApplication::font(this));
#ifdef QT_NO_TEXTHTMLPARSER
        doc->setPlainText(text);
#else
        doc->setHtml(text);
#endif
        doc->setUndoRedoEnabled(false);
        doc->adjustSize();
        r.setTop(0);
        r.setLeft(0);
        r.setSize(doc->size().toSize());
    }
    else
    {
        int sw = QGuiApplication::primaryScreen()->virtualGeometry().width() / 3;
        if (sw < 200)
            sw = 200;
        else if (sw > 300)
            sw = 300;

        r = fontMetrics().boundingRect(0, 0, sw, 1000,
                                        Qt::AlignLeft | Qt::AlignTop
                                        | Qt::TextWordWrap | Qt::TextExpandTabs,
                                        text);
    }
    shadowWidth = dropShadow() ? 0 : 6;
    resize(r.width() + 2*hMargin + shadowWidth, r.height() + 2*vMargin + shadowWidth);
}